

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O0

CallFunc * __thiscall ThreadPool::Take(CallFunc *__return_storage_ptr__,ThreadPool *this)

{
  bool bVar1;
  reference __x;
  byte local_49;
  LockGuard local_20;
  LockGuard lock;
  ThreadPool *this_local;
  CallFunc *retFunc;
  
  lock.m_mutex = (Mutex *)this;
  LockGuard::LockGuard(&local_20,&this->m_mutex);
  while( true ) {
    bVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::empty
                      (&this->m_tasks);
    local_49 = 0;
    if (bVar1) {
      local_49 = this->m_bRunning;
    }
    if ((local_49 & 1) == 0) break;
    Condition::Wait(&this->m_notEmpty);
  }
  std::function<void_()>::function(__return_storage_ptr__);
  if ((this->m_bRunning & 1U) != 0) {
    __x = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::front
                    (&this->m_tasks);
    std::function<void_()>::operator=(__return_storage_ptr__,__x);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&this->m_tasks);
    Condition::Notify(&this->m_notFull);
  }
  LockGuard::~LockGuard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

ThreadPool::CallFunc ThreadPool::Take()
{
	LockGuard lock(m_mutex);
	while(m_tasks.empty() && m_bRunning)
	{
		m_notEmpty.Wait();
	}
	
	CallFunc retFunc;
	if (m_bRunning)
	{
		retFunc = m_tasks.front();
		m_tasks.pop_front();
		m_notFull.Notify();
	}
	
	return retFunc;
}